

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockwise.c
# Opt level: O0

void cf_blockwise_acc_byte
               (uint8_t *partial,size_t *npartial,size_t nblock,uint8_t byte,size_t nbytes,
               cf_blockwise_in_fn process,void *ctx)

{
  size_t sVar1;
  bool bVar2;
  cf_blockwise_in_fn local_70;
  size_t __y;
  size_t __x;
  size_t count;
  size_t start;
  int filled;
  cf_blockwise_in_fn process_local;
  size_t nbytes_local;
  uint8_t byte_local;
  size_t nblock_local;
  size_t *npartial_local;
  uint8_t *partial_local;
  
  bVar2 = false;
  for (process_local = (cf_blockwise_in_fn)nbytes; process_local != (cf_blockwise_in_fn)0x0;
      process_local = process_local + -(long)local_70) {
    sVar1 = *npartial;
    local_70 = (cf_blockwise_in_fn)(nblock - sVar1);
    if (process_local < local_70) {
      local_70 = process_local;
    }
    if (!bVar2) {
      memset(partial + sVar1,(uint)byte,(size_t)local_70);
    }
    if ((sVar1 == 0) && (local_70 == (cf_blockwise_in_fn)nblock)) {
      bVar2 = true;
    }
    if (local_70 + sVar1 == (cf_blockwise_in_fn)nblock) {
      (*process)(ctx,partial);
      *npartial = 0;
    }
    else {
      *npartial = (size_t)(local_70 + *npartial);
    }
  }
  return;
}

Assistant:

void cf_blockwise_acc_byte(uint8_t *partial, size_t *npartial,
                           size_t nblock,
                           uint8_t byte, size_t nbytes,
                           cf_blockwise_in_fn process,
                           void *ctx)
{
  /* only memset the whole of the block once */
  int filled = 0;

  while (nbytes)
  {
    size_t start = *npartial;
    size_t count = MIN(nbytes, nblock - start);

    if (!filled)
      memset(partial + start, byte, count);

    if (start == 0 && count == nblock)
      filled = 1;

    if (start + count == nblock)
    {
      process(ctx, partial);
      *npartial = 0;
    } else {
      *npartial += count;
    }

    nbytes -= count;
  }
}